

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcBindModuleFunctionWrapper
                  (char *module,void *func,_func_void_void_ptr_char_ptr_char_ptr *ptr,char *name,
                  int index)

{
  bool bVar1;
  int iVar2;
  TraceScope traceScope;
  char *errorPos;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    bVar1 = false;
  }
  else {
    if (nullcBindModuleFunctionWrapper::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcBindModuleFunctionWrapper::token);
      if (iVar2 != 0) {
        nullcBindModuleFunctionWrapper::token =
             NULLC::TraceGetToken("nullc","nullcBindModuleFunctionWrapper");
        __cxa_guard_release(&nullcBindModuleFunctionWrapper::token);
      }
    }
    NULLC::TraceScope::TraceScope(&traceScope,nullcBindModuleFunctionWrapper::token);
    NULLC::TraceLabel(module);
    if (NULLC::compilerCtx != 0) {
      __assert_fail("!compilerCtx",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x134,
                    "nullres nullcBindModuleFunctionWrapper(const char *, void *, void (*)(void *, char *, char *), const char *, int)"
                   );
    }
    if (func == (void *)0x0) {
      __assert_fail("func",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x136,
                    "nullres nullcBindModuleFunctionWrapper(const char *, void *, void (*)(void *, char *, char *), const char *, int)"
                   );
    }
    errorPos = (char *)0x0;
    bVar1 = AddModuleFunction((Allocator *)NULLC::allocator,module,(_func_void *)0x0,func,ptr,name,
                              index,&errorPos,NULLC::errorBuf,0x10000,NULLC::optimizationLevel);
    if (!bVar1) {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
      NULLC::nullcLastError = NULLC::errorBuf;
    }
    else {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    }
    bVar1 = bVar1;
    NULLC::TraceScope::~TraceScope(&traceScope);
  }
  return bVar1;
}

Assistant:

nullres nullcBindModuleFunctionWrapper(const char* module, void *func, void (*ptr)(void *func, char* retBuf, char* argBuf), const char* name, int index)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcBindModuleFunctionWrapper");
	TRACE_LABEL(module);

	assert(!compilerCtx);

	assert(func);

	const char *errorPos = NULL;

	if(!AddModuleFunction(&allocator, module, NULL, func, ptr, name, index, &errorPos, errorBuf, NULLC_ERROR_BUFFER_SIZE, NULLC::optimizationLevel))
	{
		allocator.Clear();

		nullcLastError = errorBuf;

		return false;
	}

	allocator.Clear();

	return true;
}